

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetVersion(Btree *pBtree,int iVersion)

{
  undefined2 uVar1;
  BtShared *pBVar2;
  u8 *puVar3;
  u8 uVar4;
  int iVar5;
  
  uVar4 = (u8)iVersion;
  pBVar2 = pBtree->pBt;
  uVar1 = pBVar2->btsFlags;
  pBVar2->btsFlags = (ushort)(iVersion == 1) << 5 | uVar1 & 0xffdf;
  iVar5 = sqlite3BtreeBeginTrans(pBtree,0,(int *)0x0);
  if (iVar5 == 0) {
    puVar3 = pBVar2->pPage1->aData;
    if ((puVar3[0x12] != uVar4) || (iVar5 = 0, puVar3[0x13] != puVar3[0x12])) {
      iVar5 = sqlite3BtreeBeginTrans(pBtree,2,(int *)0x0);
      if (iVar5 == 0) {
        iVar5 = sqlite3PagerWrite(pBVar2->pPage1->pDbPage);
        if (iVar5 == 0) {
          puVar3[0x12] = uVar4;
          puVar3[0x13] = uVar4;
          iVar5 = 0;
        }
      }
    }
  }
  *(byte *)&pBVar2->btsFlags = (byte)pBVar2->btsFlags & 0xdf;
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetVersion(Btree *pBtree, int iVersion){
  BtShared *pBt = pBtree->pBt;
  int rc;                         /* Return code */

  assert( iVersion==1 || iVersion==2 );

  /* If setting the version fields to 1, do not automatically open the
  ** WAL connection, even if the version fields are currently set to 2.
  */
  pBt->btsFlags &= ~BTS_NO_WAL;
  if( iVersion==1 ) pBt->btsFlags |= BTS_NO_WAL;

  rc = sqlite3BtreeBeginTrans(pBtree, 0, 0);
  if( rc==SQLITE_OK ){
    u8 *aData = pBt->pPage1->aData;
    if( aData[18]!=(u8)iVersion || aData[19]!=(u8)iVersion ){
      rc = sqlite3BtreeBeginTrans(pBtree, 2, 0);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          aData[18] = (u8)iVersion;
          aData[19] = (u8)iVersion;
        }
      }
    }
  }

  pBt->btsFlags &= ~BTS_NO_WAL;
  return rc;
}